

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void WriteVarInt<HashWriter,(VarIntMode)0,unsigned_int>(HashWriter *os,uint n)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  byte bStack_1e;
  uchar tmp [5];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 1;
  for (; tmp[lVar2 + -1] = (lVar2 != 1) << 7 | (byte)n & 0x7f, 0x7f < n; n = (n >> 7) - 1) {
    lVar2 = lVar2 + 1;
  }
  do {
    ser_writedata8<HashWriter>(os,tmp[lVar2 + -1]);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}